

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O2

bool jessilib::equalsi<char32_t,char16_t>
               (basic_string_view<char32_t,_std::char_traits<char32_t>_> lhs,
               basic_string_view<char16_t,_std::char_traits<char16_t>_> rhs)

{
  char32_t lhs_00;
  bool bVar1;
  char16_t *pcVar2;
  jessilib *pjVar3;
  size_t sVar4;
  jessilib *extraout_RDX;
  jessilib *this;
  size_t sVar5;
  decode_result dVar6;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string;
  
  pcVar2 = rhs._M_str;
  pjVar3 = (jessilib *)rhs._M_len;
  sVar5 = 0;
  this = pjVar3;
  while( true ) {
    if ((lhs._M_len == sVar5) || (this == (jessilib *)0x0)) {
      return lhs._M_len == sVar5 && this == (jessilib *)0x0;
    }
    lhs_00 = lhs._M_str[sVar5];
    in_string._M_str = (char16_t *)pjVar3;
    in_string._M_len = (size_t)pcVar2;
    dVar6 = decode_codepoint_utf16<char16_t>(this,in_string);
    sVar4 = dVar6.units;
    if ((sVar4 == 0) || (bVar1 = equalsi(lhs_00,dVar6.codepoint), !bVar1)) break;
    pcVar2 = pcVar2 + sVar4;
    this = this + -sVar4;
    sVar5 = sVar5 + 1;
    pjVar3 = extraout_RDX;
  }
  return false;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}